

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dic_compiler.cpp
# Opt level: O2

void dic_insert_word(char *word,uint value)

{
  size_t sVar1;
  MAFSA_letter out [1024];
  
  sVar1 = SIMPLE_conv_string_to_letters(word,out,0x400);
  out[sVar1] = '\x1d';
  while( true ) {
    if (value == 0) break;
    out[sVar1 + 1] = (MAFSA_letter)(value % 0x1d);
    sVar1 = sVar1 + 1;
    value = value / 0x1d;
  }
  MAFSA::daciuk<29>::insert(&dict,out,sVar1 + 1);
  return;
}

Assistant:

void dic_insert_word(const char *word, unsigned int value)
{
	MAFSA_letter out [MAX_OUT];
	size_t out_sz;

	out_sz = SIMPLE_conv_string_to_letters(word, out, MAX_OUT);
	out[out_sz++] = SIMPLE_LETTER_DELIM;

	while (value)
	{
		out[out_sz++] = value % SIMPLE_LETTER_DELIM;
		value /= SIMPLE_LETTER_DELIM;
	}

	dict.insert(out, out_sz);
}